

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilDouble.h
# Opt level: O0

xdbl Xdbl_Add(xdbl a,xdbl b)

{
  word wVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  word local_30;
  word Mnt;
  word Exp;
  xdbl b_local;
  xdbl a_local;
  
  Exp = b;
  b_local = a;
  if (a < b) {
    Exp = a;
    b_local = b;
  }
  if (Exp <= b_local) {
    wVar1 = Xdbl_Mnt(b_local);
    wVar2 = Xdbl_Mnt(Exp);
    wVar3 = Xdbl_Exp(b_local);
    wVar4 = Xdbl_Exp(Exp);
    local_30 = wVar1 + (wVar2 >> ((char)wVar3 - (char)wVar4 & 0x3fU));
    Mnt = Xdbl_Exp(b_local);
    if (local_30 >> 0x30 != 0) {
      Mnt = Mnt + 1;
      local_30 = local_30 >> 1;
    }
    if (Mnt >> 0x10 == 0) {
      a_local = Xdbl_Create(Mnt,local_30);
    }
    else {
      a_local = Xdbl_Maximum();
    }
    return a_local;
  }
  __assert_fail("a >= b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilDouble.h"
                ,0x56,"xdbl Xdbl_Add(xdbl, xdbl)");
}

Assistant:

static inline xdbl Xdbl_Add( xdbl a, xdbl b )
{
    word Exp, Mnt;
    if ( a < b ) a ^= b, b ^= a, a ^= b;
    assert( a >= b );
    Mnt = Xdbl_Mnt(a) + (Xdbl_Mnt(b) >> (Xdbl_Exp(a) - Xdbl_Exp(b)));
    Exp = Xdbl_Exp(a);
    if ( Mnt >> 48 ) // new MSB is created
        Exp++, Mnt >>= 1;
    if ( Exp >> 16 ) // overflow
        return Xdbl_Maximum();
    return Xdbl_Create( Exp, Mnt );
}